

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

natwm_error client_handle_button_press(natwm_state *state,xcb_button_press_event_t *event)

{
  uint16_t uVar1;
  natwm_error nVar2;
  workspace *workspace;
  monitor *pmVar3;
  client *client;
  
  workspace = workspace_list_find_window_workspace(state->workspace_list,event->event);
  nVar2 = NO_ERROR;
  if (workspace != (workspace *)0x0) {
    pmVar3 = monitor_list_get_workspace_monitor(state->monitor_list,workspace);
    nVar2 = RESOLUTION_FAILURE;
    if (pmVar3 != (monitor *)0x0) {
      client = workspace_find_window_client(workspace,event->event);
      if (client != (client *)0x0) {
        uVar1 = toggle_modifiers_get_clean_mask(state->button_state->modifiers,event->state);
        if (uVar1 == 8) {
          nVar2 = button_handle_grab(state,event,&pmVar3->rect,client);
          return nVar2;
        }
        nVar2 = NO_ERROR;
        if (uVar1 == 0) {
          nVar2 = button_handle_focus(state,workspace,client);
          return nVar2;
        }
      }
    }
  }
  return nVar2;
}

Assistant:

enum natwm_error client_handle_button_press(struct natwm_state *state,
                                            xcb_button_press_event_t *event)
{
        struct workspace *workspace
                = workspace_list_find_window_workspace(state->workspace_list, event->event);

        if (workspace == NULL) {
                // Not registered with us - just pass it along
                return NO_ERROR;
        }

        struct monitor *monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, workspace);

        if (monitor == NULL) {
                return RESOLUTION_FAILURE;
        }

        struct client *client = workspace_find_window_client(workspace, event->event);

        if (client == NULL) {
                return RESOLUTION_FAILURE;
        }

        switch (toggle_modifiers_get_clean_mask(state->button_state->modifiers, event->state)) {
        case XCB_NONE:
                return button_handle_focus(state, workspace, client);
        case XCB_MOD_MASK_1:
                return button_handle_grab(state, event, &monitor->rect, client);
        default:
                return NO_ERROR;
        }
}